

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSRGBDecodeTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_0::FragmentShaderParameters::FragmentShaderParameters
          (FragmentShaderParameters *this,ShaderOutputs paramsOutputTotal,
          ShaderUniforms paramsUniformTotal,ComparisonFunction *paramsComparisonFunction,
          Blending paramsBlendRequired,Toggling paramsToggleRequired)

{
  Toggling paramsToggleRequired_local;
  Blending paramsBlendRequired_local;
  ComparisonFunction *paramsComparisonFunction_local;
  ShaderUniforms paramsUniformTotal_local;
  ShaderOutputs paramsOutputTotal_local;
  FragmentShaderParameters *this_local;
  
  this->outputTotal = paramsOutputTotal;
  this->uniformTotal = paramsUniformTotal;
  std::__cxx11::string::string((string *)&this->functionName);
  std::__cxx11::string::string((string *)&this->functionImplementation);
  this->blendRequired = paramsBlendRequired;
  this->toggleRequired = paramsToggleRequired;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->uniformsToToggle);
  if (paramsComparisonFunction == (ComparisonFunction *)0x0) {
    this->hasFunction = false;
  }
  else {
    std::__cxx11::string::operator=
              ((string *)&this->functionName,(string *)paramsComparisonFunction);
    this->functionParameters = paramsComparisonFunction->parameters;
    std::__cxx11::string::operator=
              ((string *)&this->functionImplementation,
               (string *)&paramsComparisonFunction->implementation);
    this->hasFunction = true;
  }
  return;
}

Assistant:

FragmentShaderParameters::FragmentShaderParameters	(const ShaderOutputs	paramsOutputTotal,
													 const ShaderUniforms	paramsUniformTotal,
													 ComparisonFunction*	paramsComparisonFunction,
													 Blending				paramsBlendRequired,
													 Toggling				paramsToggleRequired)
	: outputTotal									(paramsOutputTotal)
	, uniformTotal									(paramsUniformTotal)
	, blendRequired									(paramsBlendRequired)
	, toggleRequired								(paramsToggleRequired)
{
	if (paramsComparisonFunction != DE_NULL)
	{
		functionName			= paramsComparisonFunction->name;
		functionParameters		= paramsComparisonFunction->parameters;
		functionImplementation	= paramsComparisonFunction->implementation;

		hasFunction = true;
	}
	else
	{
		hasFunction = false;
	}
}